

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O0

void __thiscall
icu_63::DateTimePatternGenerator::initData
          (DateTimePatternGenerator *this,Locale *locale,UErrorCode *status)

{
  UErrorCode *status_local;
  Locale *locale_local;
  DateTimePatternGenerator *this_local;
  
  this->skipMatcher = (DateTimeMatcher *)0x0;
  this->fAvailableFormatKeyHash = (Hashtable *)0x0;
  addCanonicalItems(this,status);
  addICUPatterns(this,locale,status);
  addCLDRData(this,locale,status);
  setDateTimeFromCalendar(this,locale,status);
  setDecimalSymbols(this,locale,status);
  umtx_initOnce((UInitOnce *)&(anonymous_namespace)::initOnce,loadAllowedHourFormatsData,status);
  getAllowedHourFormats(this,locale,status);
  this->internalErrorCode = *status;
  return;
}

Assistant:

void
DateTimePatternGenerator::initData(const Locale& locale, UErrorCode &status) {
    //const char *baseLangName = locale.getBaseName(); // unused

    skipMatcher = nullptr;
    fAvailableFormatKeyHash=nullptr;
    addCanonicalItems(status);
    addICUPatterns(locale, status);
    addCLDRData(locale, status);
    setDateTimeFromCalendar(locale, status);
    setDecimalSymbols(locale, status);
    umtx_initOnce(initOnce, loadAllowedHourFormatsData, status);
    getAllowedHourFormats(locale, status);
    // If any of the above methods failed then the object is in an invalid state.
    internalErrorCode = status;
}